

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# result_interface.h
# Opt level: O0

strong_type<std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_void,_ezy::features::result_interface<ezy::features::optional_adapter>,_ezy::features::inherit_std_optional>
* __thiscall
ezy::features::result_interface<ezy::features::optional_adapter>::
impl<ezy::strong_type<std::optional<int>,void,ezy::features::result_interface<ezy::features::optional_adapter>,ezy::features::inherit_std_optional>>
::_impl::
map<ezy::strong_type<std::optional<std::__cxx11::string>,void,ezy::features::result_interface<ezy::features::optional_adapter>,ezy::features::inherit_std_optional>,ezy::features::optional_adapter<std::optional<std::__cxx11::string>>,ezy::strong_type<std::optional<int>,void,ezy::features::result_interface<ezy::features::optional_adapter>,ezy::features::inherit_std_optional>,ezy::to_string_fn_const&>
          (strong_type<std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_void,_ezy::features::result_interface<ezy::features::optional_adapter>,_ezy::features::inherit_std_optional>
           *__return_storage_ptr__,_impl *this,
          strong_type<std::optional<int>,_void,_ezy::features::result_interface<ezy::features::optional_adapter>,_ezy::features::inherit_std_optional>
          *t,to_string_fn *fn)

{
  to_string_fn *fn_local;
  strong_type<std::optional<int>,_void,_ezy::features::result_interface<ezy::features::optional_adapter>,_ezy::features::inherit_std_optional>
  *t_local;
  
  detail::
  map<ezy::strong_type<std::optional<std::__cxx11::string>,void,ezy::features::result_interface<ezy::features::optional_adapter>,ezy::features::inherit_std_optional>,ezy::features::optional_adapter<std::optional<int>>,ezy::features::optional_adapter<std::optional<std::__cxx11::string>>,ezy::strong_type<std::optional<int>,void,ezy::features::result_interface<ezy::features::optional_adapter>,ezy::features::inherit_std_optional>,ezy::to_string_fn_const&>
            (__return_storage_ptr__,(detail *)this,t,fn);
  return __return_storage_ptr__;
}

Assistant:

static constexpr Result map(ST&& t, Fn&& fn)
        {
          using SourceTrait = Adapter<typename ezy::remove_cvref_t<ST>::type>;
          return detail::map<Result, SourceTrait, ResultTrait>(std::forward<ST>(t), std::forward<Fn>(fn));
        }